

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_test.cc
# Opt level: O2

void __thiscall
CipherTest_SHA1WithSecretSuffix_Test::TestBody(CipherTest_SHA1WithSecretSuffix_Test *this)

{
  ulong len;
  int iVar1;
  char *message;
  char *in_R9;
  ScopedTrace gtest_trace_555;
  ScopedTrace gtest_trace_551;
  ScopedTrace gtest_trace_557;
  ulong local_238;
  AssertionResult gtest_ar_;
  ulong local_220;
  ulong local_218;
  Bytes local_210;
  AssertHelper local_200;
  AssertionResult gtest_ar;
  uint8_t computed [20];
  uint8_t expected [20];
  SHA_CTX ctx;
  uint8_t buf [256];
  
  RAND_bytes(buf,0x100);
  local_238 = 0;
  do {
    if (0x3f < local_238) {
      return;
    }
    testing::ScopedTrace::ScopedTrace<unsigned_long>
              (&gtest_trace_551,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x227,&local_238);
    for (local_218 = 0; local_218 < 0xc0; local_218 = local_218 + 3) {
      testing::ScopedTrace::ScopedTrace<unsigned_long>
                (&gtest_trace_555,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x22b,&local_218);
      for (local_220 = 0; local_220 <= local_218; local_220 = local_220 + 3) {
        testing::ScopedTrace::ScopedTrace<unsigned_long>
                  (&gtest_trace_557,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                   ,0x22d,&local_220);
        SHA1(buf,local_220 + local_238,expected);
        len = local_220;
        SHA1_Init((SHA_CTX *)&ctx);
        SHA1_Update((SHA_CTX *)&ctx,buf,local_238);
        iVar1 = EVP_sha1_final_with_secret_suffix(&ctx,computed,buf + local_238,len,local_218);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar1 != 0;
        if (iVar1 == 0) {
          testing::Message::Message((Message *)&local_210);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,
                     (AssertionResult *)
                     "EVP_sha1_final_with_secret_suffix( &ctx, computed, buf + prefix, secret_len, max_len)"
                     ,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                     ,0x23c,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=(&local_200,(Message *)&local_210);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          std::__cxx11::string::~string((string *)&gtest_ar);
          if ((long *)local_210.span_.data_ != (long *)0x0) {
            (**(code **)(*(long *)local_210.span_.data_ + 8))();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          testing::ScopedTrace::~ScopedTrace(&gtest_trace_557);
          testing::ScopedTrace::~ScopedTrace(&gtest_trace_555);
          testing::ScopedTrace::~ScopedTrace(&gtest_trace_551);
          return;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        gtest_ar_._0_8_ = expected;
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x14;
        local_210.span_.data_ = computed;
        local_210.span_.size_ = 0x14;
        testing::internal::CmpHelperEQ<Bytes,Bytes>
                  ((internal *)&gtest_ar,"Bytes(expected)","Bytes(computed)",(Bytes *)&gtest_ar_,
                   &local_210);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          message = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            message = *(char **)gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_210,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                     ,0x23f,message);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_210,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_210);
          if (gtest_ar_._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        testing::ScopedTrace::~ScopedTrace(&gtest_trace_557);
      }
      testing::ScopedTrace::~ScopedTrace(&gtest_trace_555);
    }
    testing::ScopedTrace::~ScopedTrace(&gtest_trace_551);
    local_238 = local_238 + 3;
  } while( true );
}

Assistant:

TEST(CipherTest, SHA1WithSecretSuffix) {
  uint8_t buf[SHA_CBLOCK * 4];
  RAND_bytes(buf, sizeof(buf));
  // Hashing should run in time independent of the bytes.
  CONSTTIME_SECRET(buf, sizeof(buf));

  // Exhaustively testing interesting cases in this function is cubic in the
  // block size, so we test in 3-byte increments.
  constexpr size_t kSkip = 3;
  // This value should be less than 8 to test the edge case when the 8-byte
  // length wraps to the next block.
  static_assert(kSkip < 8, "kSkip is too large");

  // |EVP_sha1_final_with_secret_suffix| is sensitive to the public length of
  // the partial block previously hashed. In TLS, this is the HMAC prefix, the
  // header, and the public minimum padding length.
  for (size_t prefix = 0; prefix < SHA_CBLOCK; prefix += kSkip) {
    SCOPED_TRACE(prefix);
    // The first block is treated differently, so we run with up to three
    // blocks of length variability.
    for (size_t max_len = 0; max_len < 3 * SHA_CBLOCK; max_len += kSkip) {
      SCOPED_TRACE(max_len);
      for (size_t len = 0; len <= max_len; len += kSkip) {
        SCOPED_TRACE(len);

        uint8_t expected[SHA_DIGEST_LENGTH];
        SHA1(buf, prefix + len, expected);
        CONSTTIME_DECLASSIFY(expected, sizeof(expected));

        // Make a copy of the secret length to avoid interfering with the loop.
        size_t secret_len = len;
        CONSTTIME_SECRET(&secret_len, sizeof(secret_len));

        SHA_CTX ctx;
        SHA1_Init(&ctx);
        SHA1_Update(&ctx, buf, prefix);
        uint8_t computed[SHA_DIGEST_LENGTH];
        ASSERT_TRUE(EVP_sha1_final_with_secret_suffix(
            &ctx, computed, buf + prefix, secret_len, max_len));

        CONSTTIME_DECLASSIFY(computed, sizeof(computed));
        EXPECT_EQ(Bytes(expected), Bytes(computed));
      }
    }
  }
}